

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_> uVar2;
  pointer pPVar3;
  pointer puVar4;
  anon_union_8_2_5ad2d23e_for___sigaction_handler __p;
  uint16_t uVar5;
  int iVar6;
  Events *pEVar7;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar8;
  ulong uVar9;
  Peers *pPVar10;
  ostream *poVar11;
  _Any_data *__a;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  int iVar13;
  pointer pPVar14;
  pointer puVar15;
  initializer_list<unsigned_short> __l;
  unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_> sock;
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> msgs;
  int local_208;
  vector<unsigned_short,_std::allocator<unsigned_short>_> knownPorts;
  undefined1 local_1e8 [32];
  _Any_data local_1c8;
  undefined1 local_1b8 [16];
  function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> local_1a8;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  sigaction action;
  Event local_b0;
  Event local_70;
  
  action.__sigaction_handler._0_2_ = 0x1a66;
  __a = (_Any_data *)local_1e8;
  __l._M_len = 1;
  __l._M_array = (iterator)&action;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&knownPorts,__l,(allocator_type *)__a->_M_pod_data);
  sock._M_t.super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>._M_t.
  super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
  super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl =
       (__uniq_ptr_data<P2PSocket,_std::default_delete<P2PSocket>,_true,_true>)
       (__uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>)0x0;
  local_1e8._0_4_ = 2;
  std::make_unique<P2PSocket,int>((int *)&action);
  __p = action.__sigaction_handler;
  action.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  std::__uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>::reset
            ((__uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_> *)&sock,
             (pointer)__p.sa_handler);
  std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::~unique_ptr
            ((unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_> *)&action);
  uVar2 = sock;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&action,"127.0.0.1",(allocator<char> *)local_1e8);
  P2PSocket::createServer
            ((P2PSocket *)
             uVar2._M_t.super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>._M_t.
             super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
             super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl,(string *)&action,0x22ba);
  std::__cxx11::string::~string((string *)&action);
  pEVar7 = P2PSocket::events((P2PSocket *)
                             sock._M_t.
                             super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>._M_t.
                             super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
                             super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl);
  puVar8 = Events::onPeerConnect(pEVar7);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main.cpp:26:9)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main.cpp:26:9)>
              ::_M_manager;
  Event::listen(&local_70,
                (int)(puVar8->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
                     super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                     super__Head_base<0UL,_Event_*,_false>._M_head_impl,(int)&local_168);
  Event::~Event(&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  pEVar7 = P2PSocket::events((P2PSocket *)
                             sock._M_t.
                             super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>._M_t.
                             super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
                             super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl);
  puVar8 = Events::onPeerDisconnect(pEVar7);
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_170 = std::
              _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main.cpp:28:9)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main.cpp:28:9)>
              ::_M_manager;
  Event::listen(&local_b0,
                (int)(puVar8->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
                     super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                     super__Head_base<0UL,_Event_*,_false>._M_head_impl,(int)&local_188);
  Event::~Event(&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  uVar9 = (long)knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  action.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
  iVar13 = 0;
  sigaction(0xd,(sigaction *)&action,(sigaction *)0x0);
  uVar12 = extraout_RDX;
  do {
    P2PSocket::listen((P2PSocket *)
                      sock._M_t.super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>.
                      _M_t.super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
                      super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl,0,(int)uVar12);
    std::operator<<((ostream *)&std::cout,"listening\n");
    puVar4 = knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar15 = knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        uVar2._M_t.super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>._M_t.
        super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
        super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl =
             sock._M_t.super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>._M_t.
             super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
             super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl, puVar15 != puVar4;
        puVar15 = puVar15 + 1) {
      local_208 = (int)(uVar9 >> 1);
      if (iVar13 < local_208) {
        uVar1 = *puVar15;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,"127.0.0.1",(allocator<char> *)&msgs);
        P2PSocket::connect((P2PSocket *)
                           uVar2._M_t.
                           super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>._M_t.
                           super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
                           super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl,
                           (int)(Peers *)local_1e8,(sockaddr *)(ulong)uVar1,(socklen_t)__a);
        std::__cxx11::string::~string((string *)local_1e8);
        iVar13 = iVar13 + 1;
      }
    }
    pPVar10 = P2PSocket::peers((P2PSocket *)
                               sock._M_t.
                               super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>.
                               super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl);
    iVar6 = Peers::count(pPVar10);
    if (0 < iVar6) {
      pPVar10 = P2PSocket::peers((P2PSocket *)
                                 sock._M_t.
                                 super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>
                                 .super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,"Broadcasting...",(allocator<char> *)&msgs);
      local_1a8.super__Function_base._M_manager = (_Manager_type)0x0;
      local_1a8._M_invoker = (_Invoker_type)0x0;
      local_1a8.super__Function_base._M_functor._M_unused._M_object = (_Base_ptr)0x0;
      local_1a8.super__Function_base._M_functor._8_8_ = (_Base_ptr)0x0;
      iVar6 = Peers::broadcast(pPVar10,(string *)local_1e8,&local_1a8);
      std::_Function_base::~_Function_base(&local_1a8.super__Function_base);
      std::__cxx11::string::~string((string *)local_1e8);
      poVar11 = std::operator<<((ostream *)&std::cout,"Sent: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar6);
      std::operator<<(poVar11," msgs\n");
      pPVar10 = P2PSocket::peers((P2PSocket *)
                                 sock._M_t.
                                 super___uniq_ptr_impl<P2PSocket,_std::default_delete<P2PSocket>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_P2PSocket_*,_std::default_delete<P2PSocket>_>
                                 .super__Head_base<0UL,_P2PSocket_*,_false>._M_head_impl);
      local_1b8._0_8_ = 0;
      local_1b8._8_8_ = 0;
      local_1c8._M_unused._M_object = (_Base_ptr)0x0;
      local_1c8._8_8_ = 0;
      __a = &local_1c8;
      Peers::read((Peers *)local_1e8,(int)pPVar10,(void *)0x400,(size_t)__a);
      PeersMessages::all(&msgs,(PeersMessages *)local_1e8);
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector
                ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)(local_1e8 + 8));
      std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
      pPVar3 = msgs.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pPVar14 = msgs.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                     _M_impl.super__Vector_impl_data._M_start; pPVar14 != pPVar3;
          pPVar14 = pPVar14 + 1) {
        poVar11 = std::operator<<((ostream *)&std::cout,"Recieved message: ");
        std::__cxx11::string::string((string *)local_1e8,(string *)&pPVar14->m_message);
        poVar11 = std::operator<<(poVar11,(string *)local_1e8);
        poVar11 = std::operator<<(poVar11," from ");
        uVar5 = Peer::port(pPVar14->m_peer);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar5);
        std::operator<<(poVar11,"\n");
        std::__cxx11::string::~string((string *)local_1e8);
      }
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector(&msgs);
    }
    poVar11 = std::operator<<((ostream *)&std::cout,"Sleeping...");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar13);
    std::operator<<(poVar11,"\n");
    sleep(2);
    uVar12 = extraout_RDX_00;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    std::vector<uint16_t> knownPorts = {
        6758,
    };

    std::unique_ptr<P2PSocket> sock = nullptr;

    try {
        sock = std::make_unique<P2PSocket>(2);
        sock->createServer("127.0.0.1", 8890);
    } catch(const P2PSocketException &e) {
        std::cout << e.what() << std::endl;
    }

    sock->events()->onPeerConnect()->listen(
        [](auto &&) { std::cout << "A new peer connected" << std::endl; });
    sock->events()->onPeerDisconnect()->listen(
        [](auto &&) { std::cout << "A peer disconnected" << std::endl; });

    int total = knownPorts.size();
    int connected = 0;

    struct sigaction action;
    action.sa_handler = SIG_IGN;
    sigaction(SIGPIPE, &action, 0);

    while (true) {
        try {
            sock->listen();
            std::cout << "listening\n";
        } catch (const P2PSocketException &e) {
            // std::cout << e.what() << std::endl;
        }

        for (auto port : knownPorts) {
            if (connected < total) {
                try {
                    sock->connect("127.0.0.1", port);
                } catch (const P2PSocketException &e) {
                    std::cout << e.what();
                }
                ++connected;
            }
        }

        auto peersCount = sock->peers()->count();

        if (peersCount > 0) {
            try {
                int bytes = sock->peers()->broadcast("Broadcasting...");
                std::cout << "Sent: " << bytes << " msgs\n";
            } catch (...) {
            }
            try {
                auto msgs = sock->peers()->read().all();
                for (const auto &msg : msgs) {
                    std::cout << "Recieved message: " << msg.message() << " from "
                              << msg.peer()->port() << "\n";
                }
            } catch (const PeerException &e) {
                std::cout << "No messages\n";
            }
        }

        std::cout << "Sleeping..." << connected << "\n";
        sleep(2);
    }

    std::cout << "Done, exiting...\n";
    return 0;
}